

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

Vector __thiscall xt::vector::vec(vector *this,List *list)

{
  element_type *o;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  double __z;
  double __z_00;
  Vector VVar2;
  List n;
  __shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2> local_80;
  Object local_70;
  Object local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  o = (list->super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (o->count == 0) {
    VVar2 = empty();
    _Var1 = VVar2.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    Object::Object(&local_50,&o->first);
    conj(this,__z);
    std::__shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a0,
               &(((list->super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->rest).
                super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>);
    while ((local_a0._M_ptr != (element_type *)0x0 && ((local_a0._M_ptr)->count != 0))) {
      std::__shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_90,(__shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2> *)this);
      Object::Object(&local_70,&(local_a0._M_ptr)->first);
      conj(__z_00);
      std::__shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2> *)this,&local_80);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
      std::__shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_a0,
                 &((local_a0._M_ptr)->rest).
                  super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
    _Var1._M_pi = extraout_RDX;
  }
  VVar2.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  VVar2.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Vector)VVar2.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Vector vec(List list) {
	if (list->count == 0) return empty();
	Vector ret = vector::conj(list->first);
	List n = list->rest;
	while (n && n->count) {
		ret = conj(ret, n->first);
		n = n->rest;
	}
	return ret;
	
}